

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPo.c
# Opt level: O0

void Gia_PolynBuildAdd(Pln_Man_t *p,Vec_Int_t *vTempC,Vec_Int_t *vTempM)

{
  Vec_Flt_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  int iVar2;
  int local_30;
  int iMono;
  int iConstNew;
  int iConst;
  Vec_Int_t *vTempM_local;
  Vec_Int_t *vTempC_local;
  Pln_Man_t *p_local;
  
  if (vTempM == (Vec_Int_t *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = Hsh_VecManAdd(p->pHashM,vTempM);
  }
  p->nBuilds = p->nBuilds + 1;
  iVar1 = Vec_IntSize(p->vCoefs);
  if (local_30 == iVar1) {
    iVar1 = Hsh_VecManAdd(p->pHashC,vTempC);
    Vec_IntPush(p->vCoefs,iVar1);
    p_00 = p->vCounts;
    p_01 = p->vOrder;
    iVar2 = Vec_IntEntryLast(vTempM);
    iVar2 = Vec_IntEntry(p_01,iVar2);
    Vec_FltPush(p_00,(float)iVar2);
    Vec_QuePush(p->vQue,local_30);
    if (iVar1 != 0) {
      p->nUsed = p->nUsed + 1;
    }
  }
  else {
    iVar1 = Vec_IntEntry(p->vCoefs,local_30);
    if (iVar1 != 0) {
      Gia_PolynMergeConst(vTempC,p,iVar1);
    }
    iVar2 = Hsh_VecManAdd(p->pHashC,vTempC);
    Vec_IntWriteEntry(p->vCoefs,local_30,iVar2);
    if ((iVar1 == 0) || (iVar2 != 0)) {
      if ((iVar1 == 0) && (iVar2 != 0)) {
        p->nUsed = p->nUsed + 1;
      }
    }
    else {
      p->nUsed = p->nUsed + -1;
    }
  }
  return;
}

Assistant:

static inline int Gia_PolynBuildAdd( Hsh_VecMan_t * pHashC, Hsh_VecMan_t * pHashM, Vec_Int_t * vCoefs, 
                                     Vec_Wec_t * vLit2Mono, Vec_Int_t * vTempC, Vec_Int_t * vTempM )
{
    int i, iLit, iConst, iConstNew;
    int iMono = Hsh_VecManAdd(pHashM, vTempM);
    if ( iMono == Vec_IntSize(vCoefs) ) // new monomial
    {
        // map monomial into a constant
        assert( Vec_IntSize(vTempC) > 0 );
        iConst = Hsh_VecManAdd( pHashC, vTempC );
        Vec_IntPush( vCoefs, iConst );
        // map literals into monomial
        assert( Vec_IntSize(vTempM) > 0 );
        Vec_IntForEachEntry( vTempM, iLit, i )
            Vec_WecPush( vLit2Mono, iLit, iMono ); 
        //printf( "New monomial: \n" );
        //Gia_PolynPrintMono( vTempC, vTempM );
        return 1;
    }
    // this monomial exists
    iConst = Vec_IntEntry( vCoefs, iMono );
    if ( iConst )
        Gia_PolynMergeConst( vTempC, pHashC, iConst );
    iConstNew = Hsh_VecManAdd( pHashC, vTempC );
    Vec_IntWriteEntry( vCoefs, iMono, iConstNew );
    //printf( "Old monomial: \n" );
    //Gia_PolynPrintMono( vTempC, vTempM );
    if ( iConst && !iConstNew )
        return -1;
    if ( !iConst && iConstNew )
        return 1;
    return 0;
}